

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggressive_dead_code_elim_pass.h
# Opt level: O3

void __thiscall
spvtools::opt::AggressiveDCEPass::AggressiveDCEPass
          (AggressiveDCEPass *this,bool preserve_interface,bool remove_outputs)

{
  pointer puVar1;
  
  MemPass::MemPass(&this->super_MemPass);
  (this->super_MemPass).super_Pass._vptr_Pass = (_func_int **)&PTR__AggressiveDCEPass_00936828;
  this->preserve_interface_ = preserve_interface;
  this->remove_outputs_ = remove_outputs;
  (this->entry_point_with_no_calls_cache_)._M_h._M_buckets =
       &(this->entry_point_with_no_calls_cache_)._M_h._M_single_bucket;
  (this->entry_point_with_no_calls_cache_)._M_h._M_bucket_count = 1;
  (this->entry_point_with_no_calls_cache_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->entry_point_with_no_calls_cache_)._M_h._M_element_count = 0;
  (this->entry_point_with_no_calls_cache_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->entry_point_with_no_calls_cache_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->entry_point_with_no_calls_cache_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->worklist_).c.
  super__Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->worklist_).c.
  super__Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Deque_impl_data._M_map_size = 0;
  (this->worklist_).c.
  super__Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->worklist_).c.
  super__Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->worklist_).c.
  super__Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->worklist_).c.
  super__Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->worklist_).c.
  super__Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->worklist_).c.
  super__Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->worklist_).c.
  super__Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->worklist_).c.
  super__Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
  _M_initialize_map((_Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                     *)&this->worklist_,0);
  (this->live_insts_).bits_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->live_insts_).bits_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->live_insts_).bits_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  puVar1 = (pointer)operator_new(0x80);
  (this->live_insts_).bits_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = puVar1;
  (this->live_insts_).bits_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = puVar1 + 0x10;
  *puVar1 = 0;
  puVar1[1] = 0;
  puVar1[2] = 0;
  puVar1[3] = 0;
  puVar1[4] = 0;
  puVar1[5] = 0;
  puVar1[6] = 0;
  puVar1[7] = 0;
  puVar1[8] = 0;
  puVar1[9] = 0;
  puVar1[10] = 0;
  puVar1[0xb] = 0;
  puVar1[0xc] = 0;
  puVar1[0xd] = 0;
  puVar1[0xe] = 0;
  puVar1[0xf] = 0;
  (this->live_insts_).bits_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = puVar1 + 0x10;
  (this->live_local_vars_)._M_h._M_buckets = &(this->live_local_vars_)._M_h._M_single_bucket;
  (this->live_local_vars_)._M_h._M_bucket_count = 1;
  (this->live_local_vars_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->live_local_vars_)._M_h._M_element_count = 0;
  (this->live_local_vars_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->live_local_vars_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->live_local_vars_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->to_kill_).
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->to_kill_).
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->to_kill_).
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->extensions_allowlist_)._M_h._M_buckets =
       &(this->extensions_allowlist_)._M_h._M_single_bucket;
  (this->extensions_allowlist_)._M_h._M_bucket_count = 1;
  (this->extensions_allowlist_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->extensions_allowlist_)._M_h._M_element_count = 0;
  (this->extensions_allowlist_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->extensions_allowlist_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->extensions_allowlist_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

AggressiveDCEPass(bool preserve_interface = false,
                    bool remove_outputs = false)
      : preserve_interface_(preserve_interface),
        remove_outputs_(remove_outputs) {}